

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  u32 key;
  int local_4c;
  Pgno nextOvfl;
  int rc;
  Pager *pPager;
  MemPage *pMStack_38;
  Pgno iDbPage;
  MemPage *pPtrPage;
  int isCommit_local;
  Pgno iFreePage_local;
  Pgno iPtrPage_local;
  u8 eType_local;
  MemPage *pDbPage_local;
  BtShared *pBt_local;
  
  pPager._4_4_ = pDbPage->pgno;
  _nextOvfl = pBt->pPager;
  pPtrPage._0_4_ = isCommit;
  pPtrPage._4_4_ = iFreePage;
  isCommit_local = iPtrPage;
  iFreePage_local._3_1_ = eType;
  _iPtrPage_local = pDbPage;
  pDbPage_local = (MemPage *)pBt;
  if (pPager._4_4_ < 3) {
    pBt_local._4_4_ = sqlite3CorruptError(0x118bc);
  }
  else {
    local_4c = sqlite3PagerMovepage(_nextOvfl,pDbPage->pDbPage,iFreePage,isCommit);
    pBt_local._4_4_ = local_4c;
    if (local_4c == 0) {
      _iPtrPage_local->pgno = pPtrPage._4_4_;
      if ((iFreePage_local._3_1_ == '\x05') || (iFreePage_local._3_1_ == '\x01')) {
        local_4c = setChildPtrmaps(_iPtrPage_local);
        if (local_4c != 0) {
          return local_4c;
        }
      }
      else {
        key = sqlite3Get4byte(_iPtrPage_local->aData);
        if ((key != 0) &&
           (ptrmapPut((BtShared *)pDbPage_local,key,'\x04',pPtrPage._4_4_,&local_4c), local_4c != 0)
           ) {
          return local_4c;
        }
      }
      if (iFreePage_local._3_1_ != '\x01') {
        local_4c = btreeGetPage((BtShared *)pDbPage_local,isCommit_local,&stack0xffffffffffffffc8,0)
        ;
        if (local_4c != 0) {
          return local_4c;
        }
        local_4c = sqlite3PagerWrite(pMStack_38->pDbPage);
        if (local_4c != 0) {
          releasePage(pMStack_38);
          return local_4c;
        }
        local_4c = modifyPagePointer(pMStack_38,pPager._4_4_,pPtrPage._4_4_,iFreePage_local._3_1_);
        releasePage(pMStack_38);
        if (local_4c == 0) {
          ptrmapPut((BtShared *)pDbPage_local,pPtrPage._4_4_,iFreePage_local._3_1_,isCommit_local,
                    &local_4c);
        }
      }
      pBt_local._4_4_ = local_4c;
    }
  }
  return pBt_local._4_4_;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 ||
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n",
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}